

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::Param::set_value(Param *this,shared_ptr<kratos::Param> *param)

{
  element_type *peVar1;
  pair<std::__detail::_Node_iterator<kratos::Param_*,_true,_false>,_bool> pVar2;
  
  pVar2 = std::
          _Hashtable<kratos::Param*,kratos::Param*,std::allocator<kratos::Param*>,std::__detail::_Identity,std::equal_to<kratos::Param*>,std::hash<kratos::Param*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<kratos::Param*>
                    ((_Hashtable<kratos::Param*,kratos::Param*,std::allocator<kratos::Param*>,std::__detail::_Identity,std::equal_to<kratos::Param*>,std::hash<kratos::Param*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&((param->super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->param_params_);
  peVar1 = (param->super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->parent_param_ = peVar1;
  if (peVar1->param_type_ != RawType) {
    this->param_type_ = Parameter;
  }
  (*(this->super_Const).super_Var.super_IRNode._vptr_IRNode[0x2b])
            (this,(peVar1->super_Const).value_,pVar2._8_8_);
  return;
}

Assistant:

void Param::set_value(const std::shared_ptr<Param> &param) {
    param->param_params_.emplace(this);
    parent_param_ = param.get();
    if (param->param_type() != ParamType::RawType) param_type_ = ParamType::Parameter;

    // update the values
    set_value(param->value());
}